

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void google::protobuf::anon_unknown_0::AssignDescriptorsImpl(DescriptorTable *table)

{
  Metadata *pMVar1;
  undefined8 uVar2;
  int iVar3;
  DescriptorPool *this;
  FileDescriptor *pFVar4;
  LogMessage *other;
  ulong uVar5;
  ulong uVar6;
  pthread_mutex_t *ppVar7;
  ulong uVar8;
  long lVar9;
  int i;
  long lVar10;
  undefined1 local_70 [32];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pair<const_google::protobuf::Metadata_*,_const_google::protobuf::Metadata_*> local_38;
  
  std::mutex::lock(&AssignDescriptorsImpl::mu.mu_);
  internal::AddDescriptors(table);
  pthread_mutex_unlock((pthread_mutex_t *)&AssignDescriptorsImpl::mu);
  this = DescriptorPool::internal_generated_pool();
  std::__cxx11::string::string((string *)local_70,table->filename,(allocator *)&local_38);
  pFVar4 = DescriptorPool::FindFileByName(this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  if (pFVar4 == (FileDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x92a);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_70,"CHECK failed: file != nullptr: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_38,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
  }
  local_70._0_8_ = MessageFactory::generated_factory();
  local_48._M_allocated_capacity = (size_type)table->offsets;
  local_70._8_8_ = table->file_level_metadata;
  local_70._16_8_ = table->file_level_enum_descriptors;
  local_70._24_4_ = *(undefined4 *)&table->schemas;
  local_70._28_4_ = *(undefined4 *)((long)&table->schemas + 4);
  uStack_50 = *(undefined4 *)&table->default_instances;
  uStack_4c = *(undefined4 *)((long)&table->default_instances + 4);
  lVar9 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(pFVar4 + 0x2c); lVar10 = lVar10 + 1) {
    AssignDescriptorsHelper::AssignMessageDescriptor
              ((AssignDescriptorsHelper *)local_70,(Descriptor *)(*(long *)(pFVar4 + 0x68) + lVar9))
    ;
    lVar9 = lVar9 + 0x90;
  }
  uVar5 = 0;
  uVar6 = (ulong)*(uint *)(pFVar4 + 0x30);
  if ((int)*(uint *)(pFVar4 + 0x30) < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 * 0x50 - uVar5 != 0; uVar5 = uVar5 + 0x50) {
    *(EnumDescriptor **)local_70._16_8_ = (EnumDescriptor *)(*(long *)(pFVar4 + 0x70) + uVar5);
    local_70._16_8_ = local_70._16_8_ + 8;
  }
  if (*(char *)(*(long *)(pFVar4 + 0x88) + 0x9b) == '\x01') {
    uVar5 = 0;
    uVar6 = (ulong)*(uint *)(pFVar4 + 0x34);
    if ((int)*(uint *)(pFVar4 + 0x34) < 1) {
      uVar6 = uVar5;
    }
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      table->file_level_service_descriptors[uVar8] =
           (ServiceDescriptor *)(*(long *)(pFVar4 + 0x78) + uVar5);
      uVar5 = uVar5 + 0x30;
    }
  }
  if ((anonymous_namespace)::MetadataOwner::Instance()::res == '\0') {
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::MetadataOwner::Instance()::res);
    if (iVar3 != 0) {
      ppVar7 = (pthread_mutex_t *)operator_new(0x40);
      *(undefined8 *)((long)ppVar7 + 0x30) = 0;
      *(undefined8 *)((long)ppVar7 + 0x38) = 0;
      (ppVar7->__data).__list.__next = (__pthread_internal_list *)0x0;
      ppVar7[1].__align = 0;
      *(int *)((long)ppVar7 + 0x10) = 0;
      *(int *)((long)ppVar7 + 0x14) = 0;
      (ppVar7->__data).__list.__prev = (__pthread_internal_list *)0x0;
      ppVar7->__align = 0;
      *(int *)((long)ppVar7 + 8) = 0;
      *(uint *)((long)ppVar7 + 0xc) = 0;
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::(anonymous_namespace)::MetadataOwner>
                 ::anon_class_1_0_00000001::__invoke,ppVar7);
      (anonymous_namespace)::MetadataOwner::Instance()::res = ppVar7;
      __cxa_guard_release(&(anonymous_namespace)::MetadataOwner::Instance()::res);
    }
  }
  uVar2 = local_70._8_8_;
  ppVar7 = (anonymous_namespace)::MetadataOwner::Instance()::res;
  pMVar1 = table->file_level_metadata;
  std::mutex::lock((mutex *)&(anonymous_namespace)::MetadataOwner::Instance()::res->__data);
  local_38.second = (Metadata *)uVar2;
  local_38.first = pMVar1;
  std::
  vector<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>,std::allocator<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>>>
  ::emplace_back<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>>
            ((vector<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>,std::allocator<std::pair<google::protobuf::Metadata_const*,google::protobuf::Metadata_const*>>>
              *)&ppVar7[1].__data,&local_38);
  pthread_mutex_unlock(ppVar7);
  return;
}

Assistant:

void AssignDescriptorsImpl(const DescriptorTable* table) {
  // Ensure the file descriptor is added to the pool.
  {
    // This only happens once per proto file. So a global mutex to serialize
    // calls to AddDescriptors.
    static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
    mu.Lock();
    AddDescriptors(table);
    mu.Unlock();
  }
  // Fill the arrays with pointers to descriptors and reflection classes.
  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);
  GOOGLE_CHECK(file != nullptr);

  MessageFactory* factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper helper(
      factory, table->file_level_metadata, table->file_level_enum_descriptors,
      table->schemas, table->default_instances, table->offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      table->file_level_service_descriptors[i] = file->service(i);
    }
  }
  MetadataOwner::Instance()->AddArray(table->file_level_metadata,
                                      helper.GetCurrentMetadataPtr());
}